

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O3

bool __thiscall Opcode::AABBNoLeafTree::Refit(AABBNoLeafTree *this,MeshInterface *mesh_interface)

{
  udword uVar1;
  AABBNoLeafNode *pAVar2;
  float *pfVar3;
  IndexedTriangle *pIVar4;
  Point *pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  CollisionAABB *CurrentBox;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  ulong uVar25;
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar26 [16];
  
  if ((mesh_interface != (MeshInterface *)0x0) &&
     (uVar10 = (ulong)(this->super_AABBOptimizedTree).mNbNodes, uVar10 != 0)) {
    pAVar2 = this->mNodes;
    lVar11 = uVar10 * 0x28;
    do {
      pfVar3 = *(float **)((long)pAVar2 + lVar11 + -0x10);
      if (((ulong)pfVar3 & 1) == 0) {
        fVar35 = pfVar3[2];
        fVar38 = pfVar3[3];
        fVar24 = (float)*(undefined8 *)(pfVar3 + 4);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar3 + 4) >> 0x20);
        auVar21._0_4_ = *pfVar3 - fVar38;
        auVar21._4_4_ = pfVar3[1] - fVar24;
        auVar21._8_4_ = fVar35 - fVar31;
        auVar21._12_4_ = *pfVar3 + fVar38;
        auVar23._0_4_ = pfVar3[1] + fVar24;
        auVar23._4_4_ = fVar35 + fVar31;
        auVar23._8_4_ = fVar35 + 0.0;
        auVar23._12_4_ = fVar38 + 0.0;
      }
      else {
        uVar10 = (ulong)((int)((ulong)pfVar3 >> 1) * mesh_interface->mTriStride);
        pIVar4 = mesh_interface->mTris;
        uVar1 = mesh_interface->mVertexStride;
        uVar13 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar10) * uVar1);
        uVar14 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar10 + 4) * uVar1);
        uVar12 = (ulong)(uVar1 * *(int *)((long)pIVar4->mVRef + uVar10 + 8));
        pPVar5 = mesh_interface->mVerts;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)((long)&pPVar5->x + uVar13);
        uVar10 = *(ulong *)((long)&pPVar5->x + uVar14);
        uVar25 = *(ulong *)((long)&pPVar5->x + uVar12);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar25;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar10;
        auVar22 = maxps(auVar22,auVar30);
        fVar35 = (float)(uVar25 >> 0x20);
        iVar15 = -(uint)(auVar22._0_4_ < (float)uVar25);
        iVar17 = -(uint)(auVar22._4_4_ < fVar35);
        auVar27._4_4_ = iVar17;
        auVar27._0_4_ = iVar15;
        auVar27._8_4_ = iVar17;
        auVar27._12_4_ = iVar17;
        auVar26._8_8_ = auVar27._8_8_;
        auVar26._4_4_ = iVar15;
        auVar26._0_4_ = iVar15;
        uVar16 = movmskpd((int)pIVar4,auVar26);
        if ((uVar16 & 1) == 0) {
          uVar25 = auVar22._0_8_;
        }
        if ((uVar16 & 2) == 0) {
          fVar35 = auVar22._4_4_;
        }
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar10;
        auVar30 = minps(auVar30,auVar7);
        auVar30 = minps(auVar30,auVar32);
        fVar38 = *(float *)((long)&pPVar5->z + uVar13);
        fVar24 = *(float *)((long)&pPVar5->z + uVar14);
        fVar31 = *(float *)((long)&pPVar5->z + uVar12);
        if (fVar24 <= fVar38) {
          fVar36 = fVar24;
          if (fVar31 <= fVar24) {
            fVar36 = fVar31;
          }
          if (fVar31 <= fVar38) {
            fVar31 = fVar38;
          }
        }
        else {
          fVar36 = fVar38;
          if (fVar31 <= fVar38) {
            fVar36 = fVar31;
          }
          if (fVar31 <= fVar24) {
            fVar31 = fVar24;
          }
        }
        auVar21._0_8_ = auVar30._0_8_;
        auVar21._8_4_ = fVar36;
        auVar21._12_4_ = (int)uVar25;
        auVar23._4_4_ = fVar31;
        auVar23._0_4_ = fVar35;
        auVar23._8_4_ = fVar35;
        auVar23._12_4_ = 0.0;
      }
      pfVar3 = *(float **)((long)pAVar2 + lVar11 + -8);
      if (((ulong)pfVar3 & 1) == 0) {
        fVar35 = pfVar3[2];
        fVar38 = pfVar3[3];
        fVar24 = (float)*(undefined8 *)(pfVar3 + 4);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar3 + 4) >> 0x20);
        auVar33._0_4_ = *pfVar3 - fVar38;
        auVar33._4_4_ = pfVar3[1] - fVar24;
        auVar33._8_4_ = fVar35 - fVar31;
        auVar33._12_4_ = *pfVar3 + fVar38;
        auVar29._0_4_ = pfVar3[1] + fVar24;
        auVar29._4_4_ = fVar35 + fVar31;
        auVar29._8_4_ = fVar35 + 0.0;
        auVar29._12_4_ = fVar38 + 0.0;
      }
      else {
        uVar10 = (ulong)((int)((ulong)pfVar3 >> 1) * mesh_interface->mTriStride);
        pIVar4 = mesh_interface->mTris;
        uVar1 = mesh_interface->mVertexStride;
        uVar13 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar10) * uVar1);
        uVar14 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar10 + 4) * uVar1);
        uVar12 = (ulong)(uVar1 * *(int *)((long)pIVar4->mVRef + uVar10 + 8));
        pPVar5 = mesh_interface->mVerts;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)&pPVar5->x + uVar13);
        uVar10 = *(ulong *)((long)&pPVar5->x + uVar14);
        uVar25 = *(ulong *)((long)&pPVar5->x + uVar12);
        fVar38 = (float)(uVar25 >> 0x20);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar10;
        auVar30 = maxps(auVar28,auVar34);
        iVar15 = -(uint)(auVar30._0_4_ < (float)uVar25);
        iVar17 = -(uint)(auVar30._4_4_ < fVar38);
        auVar6._4_4_ = iVar15;
        auVar6._0_4_ = iVar15;
        auVar6._8_4_ = iVar17;
        auVar6._12_4_ = iVar17;
        uVar16 = movmskpd((int)pIVar4,auVar6);
        fVar35 = (float)uVar25;
        if ((uVar16 & 1) == 0) {
          fVar35 = auVar30._0_4_;
        }
        if ((uVar16 & 2) == 0) {
          fVar38 = auVar30._4_4_;
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar10;
        auVar30 = minps(auVar34,auVar9);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar25;
        auVar30 = minps(auVar30,auVar8);
        fVar24 = *(float *)((long)&pPVar5->z + uVar13);
        fVar31 = *(float *)((long)&pPVar5->z + uVar14);
        fVar36 = *(float *)((long)&pPVar5->z + uVar12);
        if (fVar31 <= fVar24) {
          fVar37 = fVar31;
          if (fVar36 <= fVar31) {
            fVar37 = fVar36;
          }
          if (fVar36 <= fVar24) {
            fVar36 = fVar24;
          }
        }
        else {
          fVar37 = fVar24;
          if (fVar36 <= fVar24) {
            fVar37 = fVar36;
          }
          if (fVar36 <= fVar31) {
            fVar36 = fVar31;
          }
        }
        auVar33._0_8_ = auVar30._0_8_;
        auVar33._8_4_ = fVar37;
        auVar33._12_4_ = fVar35;
        auVar29._4_4_ = fVar36;
        auVar29._0_4_ = fVar38;
        auVar29._8_4_ = fVar38;
        auVar29._12_4_ = 0.0;
      }
      auVar30 = maxps(auVar29,auVar23);
      uVar16 = -(uint)(auVar21._0_4_ < auVar33._0_4_);
      uVar18 = -(uint)(auVar21._4_4_ < auVar33._4_4_);
      uVar19 = -(uint)(auVar21._8_4_ < auVar33._8_4_);
      uVar20 = -(uint)(auVar21._12_4_ < auVar33._12_4_);
      fVar35 = (float)(~uVar16 & (uint)auVar33._0_4_ | (uint)auVar21._0_4_ & uVar16);
      fVar38 = (float)(~uVar18 & (uint)auVar33._4_4_ | (uint)auVar21._4_4_ & uVar18);
      fVar24 = (float)(~uVar19 & (uint)auVar33._8_4_ | (uint)auVar21._8_4_ & uVar19);
      fVar31 = (float)(~uVar20 & (uint)auVar21._12_4_ | (uint)auVar33._12_4_ & uVar20);
      pfVar3 = (float *)((long)&pAVar2[-1].mAABB.mCenter.x + lVar11);
      *pfVar3 = (fVar31 + fVar35) * 0.5;
      pfVar3[1] = (auVar30._0_4_ + fVar38) * 0.5;
      pfVar3[2] = (auVar30._4_4_ + fVar24) * 0.5;
      pfVar3[3] = (fVar31 - fVar35) * 0.5;
      *(ulong *)((long)pAVar2 + lVar11 + -0x18) =
           CONCAT44((auVar30._4_4_ - fVar24) * 0.5,(auVar30._0_4_ - fVar38) * 0.5);
      lVar11 = lVar11 + -0x28;
    } while (lVar11 != 0);
  }
  return mesh_interface != (MeshInterface *)0x0;
}

Assistant:

bool AABBNoLeafTree::Refit(const MeshInterface* mesh_interface)
{
	// Checkings
	if(!mesh_interface)	return false;

	// Bottom-up update
	VertexPointers VP;
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mNbNodes;
	while(Index--)
	{
		AABBNoLeafNode& Current = mNodes[Index];

		if(Current.HasPosLeaf())
		{
			mesh_interface->GetTriangle(VP, Current.GetPosPrimitive());
			ComputeMinMax(Min, Max, VP);
		}
		else
		{
			const CollisionAABB& CurrentBox = Current.GetPos()->mAABB;
			CurrentBox.GetMin(Min);
			CurrentBox.GetMax(Max);
		}

		if(Current.HasNegLeaf())
		{
			mesh_interface->GetTriangle(VP, Current.GetNegPrimitive());
			ComputeMinMax(Min_, Max_, VP);
		}
		else
		{
			const CollisionAABB& CurrentBox = Current.GetNeg()->mAABB;
			CurrentBox.GetMin(Min_);
			CurrentBox.GetMax(Max_);
		}
#ifdef OPC_USE_FCOMI
		Min.x = FCMin2(Min.x, Min_.x);
		Max.x = FCMax2(Max.x, Max_.x);
		Min.y = FCMin2(Min.y, Min_.y);
		Max.y = FCMax2(Max.y, Max_.y);
		Min.z = FCMin2(Min.z, Min_.z);
		Max.z = FCMax2(Max.z, Max_.z);
#else
		Min.Min(Min_);
		Max.Max(Max_);
#endif
		Current.mAABB.SetMinMax(Min, Max);
	}
	return true;
}